

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O3

Status __thiscall leveldb::VersionEdit::DecodeFrom(VersionEdit *this,Slice *src)

{
  undefined4 uVar1;
  bool bVar2;
  undefined8 *in_RDX;
  char *__s;
  Status *result;
  InternalKey key;
  uint32_t tag;
  FileMetaData f;
  uint32_t v;
  Slice str;
  Slice input;
  uint64_t number;
  InternalKey local_188;
  uint32_t local_164;
  uint64_t *local_160;
  undefined4 uStack_158;
  undefined4 uStack_154;
  uint64_t local_150;
  InternalKey local_148;
  InternalKey local_128;
  undefined1 local_108 [8];
  uint64_t *local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  uint64_t local_f0;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Slice local_a8;
  Slice local_98;
  Slice *local_88;
  vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
  *local_80;
  Slice *local_78;
  Slice *local_70;
  size_t *local_68;
  Slice *local_60;
  size_t *local_58;
  uint64_t *local_50;
  _Alloc_hider local_48;
  Slice local_40;
  
  Clear((VersionEdit *)src);
  local_98.data_ = (char *)*in_RDX;
  local_98.size_ = in_RDX[1];
  local_148.rep_._M_dataplus._M_p = (pointer)&local_148.rep_.field_2;
  local_160 = (uint64_t *)0x4000000000000000;
  local_150 = 0;
  local_148.rep_._M_string_length = 0;
  local_148.rep_.field_2._M_local_buf[0] = '\0';
  local_128.rep_._M_dataplus._M_p = (pointer)&local_128.rep_.field_2;
  local_128.rep_._M_string_length = 0;
  local_128.rep_.field_2._M_local_buf[0] = '\0';
  local_a8.data_ = "";
  local_a8.size_ = 0;
  local_188.rep_._M_dataplus._M_p = (pointer)&local_188.rep_.field_2;
  local_188.rep_._M_string_length = 0;
  local_188.rep_.field_2._M_local_buf[0] = '\0';
  bVar2 = GetVarint32(&local_98,&local_164);
  if (bVar2) {
    local_88 = src + 9;
    local_78 = src + 6;
    local_80 = (vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
                *)&src[4].size_;
    local_58 = &src[3].size_;
    local_60 = src + 3;
    local_68 = &src[2].size_;
    local_70 = src + 2;
    do {
      __s = "unknown tag";
      switch(local_164) {
      case 1:
        bVar2 = GetLengthPrefixedSlice(&local_98,&local_a8);
        if (!bVar2) {
          __s = "comparator name";
          goto switchD_00114e14_caseD_8;
        }
        local_108 = (undefined1  [8])&uStack_f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,local_a8.data_,local_a8.data_ + local_a8.size_);
        std::__cxx11::string::operator=((string *)src,(string *)local_108);
        if (local_108 != (undefined1  [8])&uStack_f8) {
          operator_delete((void *)local_108,CONCAT44(uStack_f4,uStack_f8) + 1);
        }
        *(undefined1 *)&src[4].data_ = 1;
        break;
      case 2:
        bVar2 = GetVarint64(&local_98,(uint64_t *)local_70);
        if (!bVar2) {
          __s = "log number";
          goto switchD_00114e14_caseD_8;
        }
        *(undefined1 *)((long)&src[4].data_ + 1) = 1;
        break;
      case 3:
        bVar2 = GetVarint64(&local_98,(uint64_t *)local_60);
        if (!bVar2) {
          __s = "next file number";
          goto switchD_00114e14_caseD_8;
        }
        *(undefined1 *)((long)&src[4].data_ + 3) = 1;
        break;
      case 4:
        bVar2 = GetVarint64(&local_98,local_58);
        if (!bVar2) {
          __s = "last sequence number";
          goto switchD_00114e14_caseD_8;
        }
        *(undefined1 *)((long)&src[4].data_ + 4) = 1;
        break;
      case 5:
        bVar2 = GetVarint32(&local_98,(uint32_t *)local_108);
        if (((!bVar2) || (uVar1 = local_108._0_4_, 6 < (uint)local_108._0_4_)) ||
           (bVar2 = GetInternalKey(&local_98,&local_188), !bVar2)) {
          __s = "compaction pointer";
          goto switchD_00114e14_caseD_8;
        }
        local_108 = (undefined1  [8])CONCAT44(local_108._4_4_,uVar1);
        local_100 = &local_f0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,local_188.rep_._M_dataplus._M_p,
                   local_188.rep_._M_dataplus._M_p + local_188.rep_._M_string_length);
        std::
        vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
        ::emplace_back<std::pair<int,leveldb::InternalKey>>
                  (local_80,(pair<int,_leveldb::InternalKey> *)local_108);
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        break;
      case 6:
        bVar2 = GetVarint32(&local_98,(uint32_t *)local_108);
        if (((!bVar2) || (uVar1 = local_108._0_4_, 6 < (uint)local_108._0_4_)) ||
           (bVar2 = GetVarint64(&local_98,(uint64_t *)&local_50), !bVar2)) {
          __s = "deleted file";
          goto switchD_00114e14_caseD_8;
        }
        local_108 = (undefined1  [8])CONCAT44(local_108._4_4_,uVar1);
        local_100 = local_50;
        std::
        _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
        ::_M_insert_unique<std::pair<int,unsigned_long>>
                  ((_Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                    *)local_78,(pair<int,_unsigned_long> *)local_108);
        break;
      case 7:
        bVar2 = GetVarint32(&local_98,(uint32_t *)local_108);
        if ((((!bVar2) || (uVar1 = local_108._0_4_, 6 < (uint)local_108._0_4_)) ||
            (bVar2 = GetVarint64(&local_98,(uint64_t *)&uStack_158), !bVar2)) ||
           (((bVar2 = GetVarint64(&local_98,&local_150), !bVar2 ||
             (bVar2 = GetInternalKey(&local_98,&local_148), !bVar2)) ||
            (bVar2 = GetInternalKey(&local_98,&local_128), !bVar2)))) {
          __s = "new-file entry";
          goto switchD_00114e14_caseD_8;
        }
        local_108 = (undefined1  [8])CONCAT44(local_108._4_4_,uVar1);
        local_f0 = local_150;
        local_100 = local_160;
        uStack_f8 = uStack_158;
        uStack_f4 = uStack_154;
        local_e8._M_p = (pointer)&local_d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,local_148.rep_._M_dataplus._M_p,
                   local_148.rep_._M_dataplus._M_p + local_148.rep_._M_string_length);
        local_c8._M_p = (pointer)&local_b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,local_128.rep_._M_dataplus._M_p,
                   local_128.rep_._M_dataplus._M_p + local_128.rep_._M_string_length);
        std::
        vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
        ::emplace_back<std::pair<int,leveldb::FileMetaData>>
                  ((vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
                    *)local_88,(pair<int,_leveldb::FileMetaData> *)local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_p != &local_b8) {
          operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_p != &local_d8) {
          operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
        }
        break;
      default:
        goto switchD_00114e14_caseD_8;
      case 9:
        bVar2 = GetVarint64(&local_98,local_68);
        if (!bVar2) {
          __s = "previous log number";
          goto switchD_00114e14_caseD_8;
        }
        *(undefined1 *)((long)&src[4].data_ + 2) = 1;
      }
      bVar2 = GetVarint32(&local_98,&local_164);
    } while (bVar2);
  }
  if (local_98.size_ == 0) {
    (this->comparator_)._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    __s = "invalid tag";
switchD_00114e14_caseD_8:
    local_108 = (undefined1  [8])0x124ee1;
    local_100 = (uint64_t *)0xb;
    local_40.data_ = __s;
    local_40.size_ = strlen(__s);
    Status::Status((Status *)&local_48,kCorruption,(Slice *)local_108,&local_40);
    (this->comparator_)._M_dataplus._M_p = local_48._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.rep_._M_dataplus._M_p != &local_188.rep_.field_2) {
    operator_delete(local_188.rep_._M_dataplus._M_p,
                    CONCAT71(local_188.rep_.field_2._M_allocated_capacity._1_7_,
                             local_188.rep_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.rep_._M_dataplus._M_p != &local_128.rep_.field_2) {
    operator_delete(local_128.rep_._M_dataplus._M_p,
                    CONCAT71(local_128.rep_.field_2._M_allocated_capacity._1_7_,
                             local_128.rep_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.rep_._M_dataplus._M_p != &local_148.rep_.field_2) {
    operator_delete(local_148.rep_._M_dataplus._M_p,
                    CONCAT71(local_148.rep_.field_2._M_allocated_capacity._1_7_,
                             local_148.rep_.field_2._M_local_buf[0]) + 1);
  }
  return (Status)(char *)this;
}

Assistant:

Status VersionEdit::DecodeFrom(const Slice& src) {
  Clear();
  Slice input = src;
  const char* msg = nullptr;
  uint32_t tag;

  // Temporary storage for parsing
  int level;
  uint64_t number;
  FileMetaData f;
  Slice str;
  InternalKey key;

  while (msg == nullptr && GetVarint32(&input, &tag)) {
    switch (tag) {
      case kComparator:
        if (GetLengthPrefixedSlice(&input, &str)) {
          comparator_ = str.ToString();
          has_comparator_ = true;
        } else {
          msg = "comparator name";
        }
        break;

      case kLogNumber:
        if (GetVarint64(&input, &log_number_)) {
          has_log_number_ = true;
        } else {
          msg = "log number";
        }
        break;

      case kPrevLogNumber:
        if (GetVarint64(&input, &prev_log_number_)) {
          has_prev_log_number_ = true;
        } else {
          msg = "previous log number";
        }
        break;

      case kNextFileNumber:
        if (GetVarint64(&input, &next_file_number_)) {
          has_next_file_number_ = true;
        } else {
          msg = "next file number";
        }
        break;

      case kLastSequence:
        if (GetVarint64(&input, &last_sequence_)) {
          has_last_sequence_ = true;
        } else {
          msg = "last sequence number";
        }
        break;

      case kCompactPointer:
        if (GetLevel(&input, &level) && GetInternalKey(&input, &key)) {
          compact_pointers_.push_back(std::make_pair(level, key));
        } else {
          msg = "compaction pointer";
        }
        break;

      case kDeletedFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &number)) {
          deleted_files_.insert(std::make_pair(level, number));
        } else {
          msg = "deleted file";
        }
        break;

      case kNewFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &f.number) &&
            GetVarint64(&input, &f.file_size) &&
            GetInternalKey(&input, &f.smallest) &&
            GetInternalKey(&input, &f.largest)) {
          new_files_.push_back(std::make_pair(level, f));
        } else {
          msg = "new-file entry";
        }
        break;

      default:
        msg = "unknown tag";
        break;
    }
  }

  if (msg == nullptr && !input.empty()) {
    msg = "invalid tag";
  }

  Status result;
  if (msg != nullptr) {
    result = Status::Corruption("VersionEdit", msg);
  }
  return result;
}